

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileLibraryTargetGenerator::WriteSharedLibraryRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  string *config;
  cmTarget *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  bool bVar2;
  char *pcVar3;
  string linkFlagsConfig;
  string extraFlags;
  string linkRuleVar;
  string linkLanguage;
  allocator local_c9;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  bVar2 = cmTarget::IsFrameworkOnApple((this->super_cmMakefileTargetGenerator).Target);
  if (bVar2) {
    WriteFrameworkRules(this,relink);
    return;
  }
  config = &(this->super_cmMakefileTargetGenerator).ConfigName;
  cmTarget::GetLinkerLanguage(&local_48,(this->super_cmMakefileTargetGenerator).Target,config);
  std::__cxx11::string::string((string *)&local_68,"CMAKE_",(allocator *)&local_88);
  std::__cxx11::string::append((string *)&local_68);
  std::__cxx11::string::append((char *)&local_68);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmMakefileTargetGenerator).Target;
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::__cxx11::string::string((string *)&local_a8,"LINK_FLAGS",(allocator *)&local_c8);
  pcVar3 = cmTarget::GetProperty(this_00,&local_a8);
  (*(pcVar1->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar1,&local_88,pcVar3);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"LINK_FLAGS_",(allocator *)&local_c8);
  cmsys::SystemTools::UpperCase(&local_c8,config);
  std::__cxx11::string::append((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pcVar3 = cmTarget::GetProperty((this->super_cmMakefileTargetGenerator).Target,&local_a8);
  (*(pcVar1->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar1,&local_88,pcVar3);
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::__cxx11::string::string((string *)&local_c8,"CMAKE_SHARED_LINKER_FLAGS",&local_c9);
  cmLocalGenerator::AddConfigVariableFlags
            (&pcVar1->super_cmLocalGenerator,&local_88,&local_c8,config);
  std::__cxx11::string::~string((string *)&local_c8);
  cmMakefileTargetGenerator::AddModuleDefinitionFlag
            (&this->super_cmMakefileTargetGenerator,&local_88);
  WriteLibraryRules(this,&local_68,&local_88,relink);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteSharedLibraryRules(bool relink)
{
  if(this->Target->IsFrameworkOnApple())
    {
    this->WriteFrameworkRules(relink);
    return;
    }
  std::string linkLanguage =
    this->Target->GetLinkerLanguage(this->ConfigName);
  std::string linkRuleVar = "CMAKE_";
  linkRuleVar += linkLanguage;
  linkRuleVar += "_CREATE_SHARED_LIBRARY";

  std::string extraFlags;
  this->LocalGenerator->AppendFlags
    (extraFlags, this->Target->GetProperty("LINK_FLAGS"));
  std::string linkFlagsConfig = "LINK_FLAGS_";
  linkFlagsConfig += cmSystemTools::UpperCase(this->ConfigName);
  this->LocalGenerator->AppendFlags
    (extraFlags, this->Target->GetProperty(linkFlagsConfig));

  this->LocalGenerator->AddConfigVariableFlags
    (extraFlags, "CMAKE_SHARED_LINKER_FLAGS", this->ConfigName);
  this->AddModuleDefinitionFlag(extraFlags);

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}